

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_logging_unittest.cc
# Opt level: O0

void TestSTLLogging(void)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *v1;
  vector<int,_std::allocator<int>_> *v2;
  mapped_type *pmVar2;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *v1_00;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *v2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v1_01;
  char **v2_01;
  string *str;
  mapped_type *pmVar3;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *v1_02;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *v2_02;
  CheckOpString local_ab8;
  LogMessage local_ab0;
  string *local_a50;
  _Check_string *_result_3;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  copied_m_1;
  undefined1 local_9f8 [8];
  ostringstream ss_3;
  key_type local_87c [3];
  undefined1 local_870 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m_1;
  LogMessage local_838;
  char *local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string *local_7b0;
  _Check_string *_result_2;
  ostringstream ss_2;
  value_type_conflict1 local_62c;
  char local_628 [8];
  char buf [256];
  size_t buf_size;
  string local_510 [4];
  int i;
  string expected;
  vector<int,_std::allocator<int>_> v_1;
  LogMessage local_4d0;
  string *local_470;
  _Check_string *_result_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  copied_m;
  undefined1 local_418 [8];
  ostringstream ss_1;
  key_type local_29c [3];
  undefined1 local_290 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  LogMessage local_258;
  string *local_1f8;
  _Check_string *_result;
  vector<int,_std::allocator<int>_> copied_v;
  undefined1 local_1b8 [8];
  ostringstream ss;
  value_type_conflict1 local_3c [6];
  value_type_conflict1 local_24;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_20);
  local_24 = 10;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_20,&local_24);
  local_3c[1] = 0x14;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_20,local_3c + 1);
  local_3c[0] = 0x1e;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_20,local_3c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  operator<<((ostream *)local_1b8,(vector<int,_std::allocator<int>_> *)local_20);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &copied_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,"10 20 30");
  std::__cxx11::string::~string
            ((string *)
             &copied_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","ss.str()","==","\"10 20 30\"");
    exit(1);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&_result,
             (vector<int,_std::allocator<int>_> *)local_20);
  v1 = google::GetReferenceableValue<std::vector<int,std::allocator<int>>>
                 ((vector<int,_std::allocator<int>_> *)local_20);
  v2 = google::GetReferenceableValue<std::vector<int,std::allocator<int>>>
                 ((vector<int,_std::allocator<int>_> *)&_result);
  local_1f8 = google::
              Check_EQImpl<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                        (v1,v2,"v == copied_v");
  if (local_1f8 != (string *)0x0) {
    google::CheckOpString::CheckOpString
              ((CheckOpString *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count,local_1f8);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stl_logging_unittest.cc"
               ,0x3c,(CheckOpString *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count);
    google::LogMessage::stream(&local_258);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_258);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&_result);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_290);
  local_29c[2] = 0x14;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_290,local_29c + 2);
  std::__cxx11::string::operator=((string *)pmVar2,"twenty");
  local_29c[1] = 10;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_290,local_29c + 1);
  std::__cxx11::string::operator=((string *)pmVar2,"ten");
  local_29c[0] = 0x1e;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_290,local_29c);
  std::__cxx11::string::operator=((string *)pmVar2,"thirty");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
  operator<<((ostream *)local_418,
             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_290);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &copied_m._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          "(10, ten) (20, twenty) (30, thirty)");
  std::__cxx11::string::~string
            ((string *)&copied_m._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","ss.str()","==",
            "\"(10, ten) (20, twenty) (30, thirty)\"");
    exit(1);
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&_result_1,
        (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_290);
  v1_00 = google::
          GetReferenceableValue<std::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                    ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_290);
  v2_00 = google::
          GetReferenceableValue<std::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                    ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&_result_1);
  local_470 = google::
              Check_EQImpl<std::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                        (v1_00,v2_00,"m == copied_m");
  if (local_470 != (string *)0x0) {
    google::CheckOpString::CheckOpString
              ((CheckOpString *)
               &v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,local_470);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stl_logging_unittest.cc"
               ,0x49,(CheckOpString *)
                     &v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    google::LogMessage::stream(&local_4d0);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4d0);
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&_result_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_290);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)((long)&expected.field_2 + 8));
  std::__cxx11::string::string(local_510);
  for (buf_size._4_4_ = 0; (int)buf_size._4_4_ < 100; buf_size._4_4_ = buf_size._4_4_ + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)((long)&expected.field_2 + 8),
               (value_type_conflict1 *)((long)&buf_size + 4));
    if (0 < (int)buf_size._4_4_) {
      std::__cxx11::string::operator+=(local_510,' ');
    }
    snprintf(local_628,0x100,"%d",(ulong)buf_size._4_4_);
    std::__cxx11::string::operator+=(local_510,local_628);
  }
  local_62c = 100;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)((long)&expected.field_2 + 8),&local_62c);
  std::__cxx11::string::operator+=(local_510," ...");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_result_2);
  operator<<((ostream *)&_result_2,
             (vector<int,_std::allocator<int>_> *)((long)&expected.field_2 + 8));
  std::__cxx11::ostringstream::str();
  v1_01 = google::GetReferenceableValue<std::__cxx11::string>(&local_7d0);
  local_7d8 = (char *)std::__cxx11::string::c_str();
  v2_01 = google::GetReferenceableValue<char_const*>(&local_7d8);
  str = google::Check_EQImpl<std::__cxx11::string,char_const*>
                  (v1_01,v2_01,"ss.str() == expected.c_str()");
  std::__cxx11::string::~string((string *)&local_7d0);
  local_7b0 = str;
  if (str != (string *)0x0) {
    google::CheckOpString::CheckOpString
              ((CheckOpString *)&m_1._M_t._M_impl.super__Rb_tree_header._M_node_count,str);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_838,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stl_logging_unittest.cc"
               ,0x5c,(CheckOpString *)&m_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    google::LogMessage::stream(&local_838);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_838);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_result_2);
  std::__cxx11::string::~string(local_510);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)((long)&expected.field_2 + 8));
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_870);
  local_87c[2] = 0x14;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_870,local_87c + 2);
  std::__cxx11::string::operator=((string *)pmVar3,"twenty");
  local_87c[1] = 10;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_870,local_87c + 1);
  std::__cxx11::string::operator=((string *)pmVar3,"ten");
  local_87c[0] = 0x1e;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_870,local_87c);
  std::__cxx11::string::operator=((string *)pmVar3,"thirty");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9f8);
  operator<<((ostream *)local_9f8,
             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_870);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &copied_m_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          "(30, thirty) (20, twenty) (10, ten)");
  std::__cxx11::string::~string
            ((string *)&copied_m_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","ss.str()","==",
            "\"(30, thirty) (20, twenty) (10, ten)\"");
    exit(1);
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&_result_3,
        (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_870);
  v1_02 = google::
          GetReferenceableValue<std::map<int,std::__cxx11::string,std::greater<void>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                    ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_870);
  v2_02 = google::
          GetReferenceableValue<std::map<int,std::__cxx11::string,std::greater<void>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                    ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&_result_3);
  local_a50 = google::
              Check_EQImpl<std::map<int,std::__cxx11::string,std::greater<void>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::map<int,std::__cxx11::string,std::greater<void>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                        (v1_02,v2_02,"m == copied_m");
  if (local_a50 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_ab8,local_a50);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ab0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stl_logging_unittest.cc"
               ,0x6a,&local_ab8);
    google::LogMessage::stream(&local_ab0);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ab0);
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&_result_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9f8);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<void>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_870);
  return;
}

Assistant:

static void TestSTLLogging() {
  {
    // Test a sequence.
    vector<int> v;
    v.push_back(10);
    v.push_back(20);
    v.push_back(30);
    ostringstream ss;
    ss << v;
    EXPECT_EQ(ss.str(), "10 20 30");
    vector<int> copied_v(v);
    CHECK_EQ(v, copied_v);  // This must compile.
  }

  {
    // Test a sorted pair associative container.
    map<int, string> m;
    m[20] = "twenty";
    m[10] = "ten";
    m[30] = "thirty";
    ostringstream ss;
    ss << m;
    EXPECT_EQ(ss.str(), "(10, ten) (20, twenty) (30, thirty)");
    map<int, string> copied_m(m);
    CHECK_EQ(m, copied_m);  // This must compile.
  }

  {
    // Test a long sequence.
    vector<int> v;
    string expected;
    for (int i = 0; i < 100; i++) {
      v.push_back(i);
      if (i > 0) expected += ' ';
      const size_t buf_size = 256;
      char buf[buf_size];
      std::snprintf(buf, buf_size, "%d", i);
      expected += buf;
    }
    v.push_back(100);
    expected += " ...";
    ostringstream ss;
    ss << v;
    CHECK_EQ(ss.str(), expected.c_str());
  }

  {
    // Test a sorted pair associative container.
    // Use a non-default comparison functor.
    map<int, string, greater<>> m;
    m[20] = "twenty";
    m[10] = "ten";
    m[30] = "thirty";
    ostringstream ss;
    ss << m;
    EXPECT_EQ(ss.str(), "(30, thirty) (20, twenty) (10, ten)");
    map<int, string, greater<>> copied_m(m);
    CHECK_EQ(m, copied_m);  // This must compile.
  }
}